

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O1

int cfg_tobin_strarray(void *reference,size_t bin_size,const_strarray *value,size_t array_size)

{
  int iVar1;
  
  iVar1 = -1;
  if (array_size <= bin_size) {
    strscpy((char *)reference,value->value,array_size);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
cfg_tobin_strarray(void *reference, size_t bin_size, const struct const_strarray *value, size_t array_size) {
  char *ptr;

  if (bin_size < array_size) {
    return -1;
  }

  ptr = (char *)reference;

  strscpy(ptr, strarray_get_first_c(value), array_size);
  return 0;
}